

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

t_gobj * canvas_findhitbox(_glist *x,int xpos,int ypos,int *x1p,int *y1p,int *x2p,int *y2p)

{
  t_gobj *y;
  int iVar1;
  t_gobj **pptVar2;
  t_selection *ptVar3;
  int y2;
  int x2;
  int y1;
  int x1;
  t_gobj *local_48;
  int *local_40;
  int *local_38;
  
  *x1p = -0x7fffffff;
  local_48 = (t_gobj *)0x0;
  pptVar2 = &x->gl_list;
  local_40 = y1p;
  local_38 = x2p;
  while (y = *pptVar2, y != (t_gobj *)0x0) {
    iVar1 = canvas_hitbox(x,y,xpos,ypos,&x1,&y1,&x2,&y2);
    if ((iVar1 != 0) && (*x1p < x1)) {
      *x1p = x1;
      *local_40 = y1;
      *local_38 = x2;
      *y2p = y2;
      local_48 = y;
    }
    pptVar2 = &y->g_next;
  }
  if (((x->gl_editor != (t_editor *)0x0) &&
      (ptVar3 = x->gl_editor->e_selection, ptVar3 != (t_selection *)0x0)) &&
     (ptVar3->sel_next != (_selection *)0x0)) {
    iVar1 = glist_isselected(x,(t_gobj *)0x0);
    if (iVar1 == 0) {
      for (; ptVar3 != (t_selection *)0x0; ptVar3 = ptVar3->sel_next) {
        iVar1 = canvas_hitbox(x,ptVar3->sel_what,xpos,ypos,&x1,&y1,&x2,&y2);
        if (iVar1 != 0) {
          *x1p = x1;
          *local_40 = y1;
          *local_38 = x2;
          *y2p = y2;
          local_48 = ptVar3->sel_what;
        }
      }
    }
  }
  return local_48;
}

Assistant:

static t_gobj *canvas_findhitbox(t_canvas *x, int xpos, int ypos,
    int *x1p, int *y1p, int *x2p, int *y2p)
{
    t_gobj *y, *rval = 0;
    int x1, y1, x2, y2;
    *x1p = -0x7fffffff;
    for (y = x->gl_list; y; y = y->g_next)
    {
        if (canvas_hitbox(x, y, xpos, ypos, &x1, &y1, &x2, &y2)
            && (x1 > *x1p))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2, rval = y;
    }
        /* if there are at least two selected objects, we'd prefer
           to find a selected one (never mind which) to the one we got. */
    if (x->gl_editor && x->gl_editor->e_selection &&
        x->gl_editor->e_selection->sel_next && !glist_isselected(x, y))
    {
        t_selection *sel;
        for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
            if (canvas_hitbox(x, sel->sel_what, xpos, ypos, &x1, &y1, &x2, &y2))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2,
                    rval = sel->sel_what;
    }
    return (rval);
}